

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

bool __thiscall
AddrManImpl::AddSingle(AddrManImpl *this,CAddress *addr,CNetAddr *source,seconds time_penalty)

{
  ServiceFlags *pSVar1;
  int iVar2;
  CNetAddr *pCVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  AddrInfo *this_00;
  time_point tVar7;
  long lVar8;
  rep rVar9;
  CNetAddr *pCVar10;
  long lVar11;
  mapped_type *this_01;
  Logger *this_02;
  long lVar12;
  CNetAddr *pCVar13;
  uint uVar14;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  uint32_t mapped_as;
  int nUBucketPos;
  int nUBucket;
  nid_type nId;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = CNetAddr::IsRoutable((CNetAddr *)addr);
  if (bVar4) {
    this_00 = Find(this,&addr->super_CService,&nId);
    bVar4 = ::operator==((CNetAddr *)addr,source);
    if (bVar4) {
      time_penalty.__r = 0;
    }
    if (this_00 == (AddrInfo *)0x0) {
      this_00 = Create(this,addr,source,&nId);
      lVar11 = (this_00->super_CAddress).nTime.__d.__r - time_penalty.__r;
      rVar9 = 0;
      if (0 < lVar11) {
        rVar9 = lVar11;
      }
      (this_00->super_CAddress).nTime.__d.__r = rVar9;
    }
    else {
      tVar7 = NodeClock::now();
      lVar11 = (addr->nTime).__d.__r;
      lVar12 = lVar11 - time_penalty.__r;
      lVar8 = lVar12 + -0x15180;
      if (lVar11 * -1000000000 + (long)tVar7.__d.__r < 86400000000000) {
        lVar8 = lVar12 + -0xe10;
      }
      if ((this_00->super_CAddress).nTime.__d.__r < lVar8) {
        rVar9 = 0;
        if (0 < lVar12) {
          rVar9 = lVar12;
        }
        (this_00->super_CAddress).nTime.__d.__r = rVar9;
      }
      pSVar1 = &(this_00->super_CAddress).nServices;
      *pSVar1 = *pSVar1 | addr->nServices;
      if ((((addr->nTime).__d.__r <= (this_00->super_CAddress).nTime.__d.__r) ||
          (this_00->fInTried != false)) || (iVar2 = this_00->nRefCount, iVar2 == 8))
      goto LAB_0085c878;
      if (0 < iVar2) {
        uVar14 = ~(-1 << ((byte)iVar2 & 0x1f));
        uVar6 = 0x20;
        if (uVar14 != 0) {
          uVar6 = 0x1f;
          if (uVar14 != 0) {
            for (; uVar14 >> uVar6 == 0; uVar6 = uVar6 - 1) {
            }
          }
          uVar6 = uVar6 ^ 0x1f;
        }
        pCVar13 = source;
        do {
          pCVar10 = (CNetAddr *)
                    RandomMixin<FastRandomContext>::randbits
                              (&(this->insecure_rand).super_RandomMixin<FastRandomContext>,
                               0x20 - uVar6);
          pCVar3 = pCVar13;
          if (pCVar10 <= (CNetAddr *)(ulong)uVar14) {
            pCVar3 = pCVar10;
          }
          pCVar13 = (CNetAddr *)((ulong)pCVar3 & 0xffffffff);
        } while ((CNetAddr *)(ulong)uVar14 < pCVar10);
        if ((int)pCVar3 != 0) goto LAB_0085c878;
      }
    }
    nUBucket = AddrInfo::GetNewBucket(this_00,&this->nKey,source,this->m_netgroupman);
    nUBucketPos = AddrInfo::GetBucketPosition(this_00,&this->nKey,true,nUBucket);
    lVar11 = this->vvNew[nUBucket][(uint)nUBucketPos];
    bVar4 = lVar11 == -1;
    if (lVar11 != nId) {
      if (lVar11 != -1) {
        this_01 = std::__detail::
                  _Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->mapInfo,this->vvNew[nUBucket] + (uint)nUBucketPos);
        tVar7 = NodeClock::now();
        bVar5 = AddrInfo::IsTerrible(this_01,(NodeSeconds)((long)tVar7.__d.__r / 1000000000));
        if ((bVar5) || ((1 < this_01->nRefCount && (this_00->nRefCount == 0)))) {
          bVar4 = true;
        }
      }
      if (bVar4 == false) {
        if (this_00->nRefCount == 0) {
          Delete(this,nId);
        }
      }
      else {
        ClearNew(this,nUBucket,nUBucketPos);
        this_00->nRefCount = this_00->nRefCount + 1;
        this->vvNew[nUBucket][nUBucketPos] = nId;
        mapped_as = NetGroupManager::GetMappedAS(this->m_netgroupman,(CNetAddr *)addr);
        this_02 = LogInstance();
        bVar5 = BCLog::Logger::WillLogCategoryLevel(this_02,ADDRMAN,Debug);
        if (bVar5) {
          CService::ToStringAddrPort_abi_cxx11_(&local_58,&addr->super_CService);
          if (mapped_as == 0) {
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
          }
          else {
            tinyformat::format<unsigned_int>(&local_78," mapped to AS%i",&mapped_as);
          }
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
          ;
          source_file._M_len = 0x5b;
          logging_function._M_str = "AddSingle";
          logging_function._M_len = 9;
          LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,int,int>
                    (logging_function,source_file,0x268,ADDRMAN,Debug,
                     (ConstevalFormatString<4U>)0xf8f05d,&local_58,&local_78,&nUBucket,&nUBucketPos)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
  }
  else {
LAB_0085c878:
    bVar4 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool AddrManImpl::AddSingle(const CAddress& addr, const CNetAddr& source, std::chrono::seconds time_penalty)
{
    AssertLockHeld(cs);

    if (!addr.IsRoutable())
        return false;

    nid_type nId;
    AddrInfo* pinfo = Find(addr, &nId);

    // Do not set a penalty for a source's self-announcement
    if (addr == source) {
        time_penalty = 0s;
    }

    if (pinfo) {
        // periodically update nTime
        const bool currently_online{NodeClock::now() - addr.nTime < 24h};
        const auto update_interval{currently_online ? 1h : 24h};
        if (pinfo->nTime < addr.nTime - update_interval - time_penalty) {
            pinfo->nTime = std::max(NodeSeconds{0s}, addr.nTime - time_penalty);
        }

        // add services
        pinfo->nServices = ServiceFlags(pinfo->nServices | addr.nServices);

        // do not update if no new information is present
        if (addr.nTime <= pinfo->nTime) {
            return false;
        }

        // do not update if the entry was already in the "tried" table
        if (pinfo->fInTried)
            return false;

        // do not update if the max reference count is reached
        if (pinfo->nRefCount == ADDRMAN_NEW_BUCKETS_PER_ADDRESS)
            return false;

        // stochastic test: previous nRefCount == N: 2^N times harder to increase it
        if (pinfo->nRefCount > 0) {
            const int nFactor{1 << pinfo->nRefCount};
            if (insecure_rand.randrange(nFactor) != 0) return false;
        }
    } else {
        pinfo = Create(addr, source, &nId);
        pinfo->nTime = std::max(NodeSeconds{0s}, pinfo->nTime - time_penalty);
    }

    int nUBucket = pinfo->GetNewBucket(nKey, source, m_netgroupman);
    int nUBucketPos = pinfo->GetBucketPosition(nKey, true, nUBucket);
    bool fInsert = vvNew[nUBucket][nUBucketPos] == -1;
    if (vvNew[nUBucket][nUBucketPos] != nId) {
        if (!fInsert) {
            AddrInfo& infoExisting = mapInfo[vvNew[nUBucket][nUBucketPos]];
            if (infoExisting.IsTerrible() || (infoExisting.nRefCount > 1 && pinfo->nRefCount == 0)) {
                // Overwrite the existing new table entry.
                fInsert = true;
            }
        }
        if (fInsert) {
            ClearNew(nUBucket, nUBucketPos);
            pinfo->nRefCount++;
            vvNew[nUBucket][nUBucketPos] = nId;
            const auto mapped_as{m_netgroupman.GetMappedAS(addr)};
            LogDebug(BCLog::ADDRMAN, "Added %s%s to new[%i][%i]\n",
                     addr.ToStringAddrPort(), (mapped_as ? strprintf(" mapped to AS%i", mapped_as) : ""), nUBucket, nUBucketPos);
        } else {
            if (pinfo->nRefCount == 0) {
                Delete(nId);
            }
        }
    }
    return fInsert;
}